

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O0

void __thiscall
cmCursesLongMessageForm::cmCursesLongMessageForm
          (cmCursesLongMessageForm *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *messages,char *title,ScrollBehavior scrollBehavior)

{
  char *rng;
  string_view local_68;
  string_view local_58;
  string local_48;
  ScrollBehavior local_24;
  char *pcStack_20;
  ScrollBehavior scrollBehavior_local;
  char *title_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *messages_local;
  cmCursesLongMessageForm *this_local;
  
  local_24 = scrollBehavior;
  pcStack_20 = title;
  title_local = (char *)messages;
  messages_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  cmCursesForm::cmCursesForm(&this->super_cmCursesForm);
  (this->super_cmCursesForm)._vptr_cmCursesForm =
       (_func_int **)&PTR__cmCursesLongMessageForm_00f4a7a8;
  std::__cxx11::string::string((string *)&this->Messages);
  std::__cxx11::string::string((string *)&this->Title);
  rng = title_local;
  this->Scrolling = local_24;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"\n");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68);
  cmJoin(&local_48,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)rng,local_58,local_68);
  std::__cxx11::string::operator=((string *)&this->Messages,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::operator=((string *)&this->Title,pcStack_20);
  this->Fields[0] = (FIELD *)0x0;
  this->Fields[1] = (FIELD *)0x0;
  return;
}

Assistant:

cmCursesLongMessageForm::cmCursesLongMessageForm(
  std::vector<std::string> const& messages, const char* title,
  ScrollBehavior scrollBehavior)
  : Scrolling(scrollBehavior)
{
  // Append all messages into on big string
  this->Messages = cmJoin(messages, "\n");
  this->Title = title;
  this->Fields[0] = nullptr;
  this->Fields[1] = nullptr;
}